

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::setOptimizer
          (MultipleShootingSolver *this,shared_ptr<iDynTree::optimization::Optimizer> *optimizer)

{
  element_type *peVar1;
  element_type *peVar2;
  int iVar3;
  char *pcVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  peVar1 = (optimizer->
           super___shared_ptr<iDynTree::optimization::Optimizer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  if (peVar1 == (element_type *)0x0) {
    pcVar4 = "Empty optimizer pointer";
  }
  else {
    local_28 = (this->m_transcription).
               super___shared_ptr<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    local_20 = (this->m_transcription).
               super___shared_ptr<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_20->_M_use_count = local_20->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_20->_M_use_count = local_20->_M_use_count + 1;
      }
    }
    iVar3 = (*peVar1->_vptr_Optimizer[3])(peVar1,&local_28);
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    }
    if ((char)iVar3 != '\0') {
      (this->m_optimizer).
      super___shared_ptr<iDynTree::optimization::Optimizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (optimizer->
           super___shared_ptr<iDynTree::optimization::Optimizer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->m_optimizer).
                  super___shared_ptr<iDynTree::optimization::Optimizer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 &(optimizer->
                  super___shared_ptr<iDynTree::optimization::Optimizer,_(__gnu_cxx::_Lock_policy)2>)
                  ._M_refcount);
      peVar2 = (this->m_transcription).
               super___shared_ptr<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      (*((this->m_optimizer).
         super___shared_ptr<iDynTree::optimization::Optimizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_Optimizer[0xb])();
      peVar2->m_plusInfinity = extraout_XMM0_Qa;
      peVar2 = (this->m_transcription).
               super___shared_ptr<iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      (*((this->m_optimizer).
         super___shared_ptr<iDynTree::optimization::Optimizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_Optimizer[10])();
      peVar2->m_minusInfinity = extraout_XMM0_Qa_00;
      return true;
    }
    pcVar4 = "Cannot use the selected optimizer to solve the specified optimal control problem.";
  }
  iDynTree::reportError("MultipleShootingSolver","setOptimizer",pcVar4);
  return false;
}

Assistant:

bool MultipleShootingSolver::setOptimizer(std::shared_ptr<optimization::Optimizer> optimizer)
        {
            if (!optimizer) {
                reportError("MultipleShootingSolver", "setOptimizer", "Empty optimizer pointer");
                return false;
            }

            if (!(optimizer->setProblem(m_transcription))){
                reportError("MultipleShootingSolver", "setOptimizer", "Cannot use the selected optimizer to solve the specified optimal control problem.");
                return false;
            }

            m_optimizer = optimizer;

            m_transcription->setPlusInfinity(m_optimizer->plusInfinity());

            m_transcription->setMinusInfinity(m_optimizer->minusInfinity());

            return true;
        }